

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderIncompleteProgramObjectsTest::iterate
          (GeometryShaderIncompleteProgramObjectsTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_type sVar6;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  MessageBuilder local_1c8;
  int local_44;
  reference pvStack_40;
  GLint link_status;
  _run *current_run;
  long lStack_30;
  uint run_index;
  Functions *gl;
  byte local_11;
  GeometryShaderIncompleteProgramObjectsTest *pGStack_10;
  bool result;
  GeometryShaderIncompleteProgramObjectsTest *this_local;
  
  local_11 = 1;
  pGStack_10 = this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0xb2);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTestRuns(this);
  initShaderObjects(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  current_run._4_4_ = 0;
  while( true ) {
    uVar5 = (ulong)current_run._4_4_;
    sVar6 = std::
            vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
            ::size(&this->m_test_runs);
    if (sVar6 <= uVar5) break;
    pvStack_40 = std::
                 vector<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
                 ::operator[](&this->m_test_runs,(ulong)current_run._4_4_);
    GVar2 = (**(code **)(lStack_30 + 0x3c8))();
    this->m_po_id = GVar2;
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glCreateProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0xc4);
    if ((pvStack_40->use_separable_po & 1U) != 0) {
      (**(code **)(lStack_30 + 0x1058))(this->m_po_id,0x8258,1);
      dVar3 = (**(code **)(lStack_30 + 0x800))();
      glu::checkError(dVar3,"glProgramParameteri() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xc9);
    }
    if ((pvStack_40->use_fs & 1U) != 0) {
      (**(code **)(lStack_30 + 0x10))(this->m_po_id,this->m_fs_id);
    }
    if ((pvStack_40->use_gs & 1U) != 0) {
      (**(code **)(lStack_30 + 0x10))(this->m_po_id,this->m_gs_id);
    }
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glAttachShader() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0xd6);
    (**(code **)(lStack_30 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0xda);
    local_44 = 0;
    (**(code **)(lStack_30 + 0x9d8))(this->m_po_id,0x8b82,&local_44);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0xe0);
    if ((((pvStack_40->use_separable_po & 1U) != 0) && (local_44 != 1)) ||
       (((pvStack_40->use_separable_po & 1U) == 0 && (local_44 == 1)))) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_1c8,(char (*) [36])"Invalid link status reported for a ");
      local_1d0 = "";
      if ((pvStack_40->use_separable_po & 1U) != 0) {
        local_1d0 = "separable";
      }
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1d0);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [60])
                                 " program object, to which the following SOs were attached: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])"FS:");
      local_1d8 = "NO";
      if ((pvStack_40->use_fs & 1U) != 0) {
        local_1d8 = "YES";
      }
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1d8);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])", GS:");
      local_1e0 = "NO";
      if ((pvStack_40->use_gs & 1U) != 0) {
        local_1e0 = "YES";
      }
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1e0);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      local_11 = 0;
    }
    (**(code **)(lStack_30 + 0x448))(this->m_po_id);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glDeleteProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0xf0);
    current_run._4_4_ = current_run._4_4_ + 1;
  }
  if ((local_11 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteProgramObjectsTest::iterate()
{
	bool result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize test runs */
	initTestRuns();

	/* Set up shader objects */
	initShaderObjects();

	/* Iterate over the test run set */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int run_index = 0; run_index < m_test_runs.size(); ++run_index)
	{
		const _run& current_run = m_test_runs[run_index];

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		if (current_run.use_separable_po)
		{
			gl.programParameteri(m_po_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramParameteri() call failed");
		} /* if (current_run.use_separable_po) */

		if (current_run.use_fs)
		{
			gl.attachShader(m_po_id, m_fs_id);
		}

		if (current_run.use_gs)
		{
			gl.attachShader(m_po_id, m_gs_id);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if ((current_run.use_separable_po && link_status != GL_TRUE) ||
			(!current_run.use_separable_po && link_status == GL_TRUE))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid link status reported for a "
							   << ((current_run.use_separable_po) ? "separable" : "")
							   << " program object, to which the following SOs were attached: "
							   << "FS:" << ((current_run.use_fs) ? "YES" : "NO")
							   << ", GS:" << ((current_run.use_gs) ? "YES" : "NO") << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Clean up for the next iteration */
		gl.deleteProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed");
	} /* for (all test runs) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}